

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

void udata_setCommonData_63(void *data,UErrorCode *pErrorCode)

{
  UBool UVar1;
  undefined1 local_50 [8];
  UDataMemory dataMemory;
  UErrorCode *pErrorCode_local;
  void *data_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) &&
     (dataMemory._48_8_ = pErrorCode, UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (data == (void *)0x0) {
      *(undefined4 *)dataMemory._48_8_ = 1;
    }
    else {
      UDataMemory_init_63((UDataMemory *)local_50);
      UDataMemory_setData_63((UDataMemory *)local_50,data);
      udata_checkCommonData_63((UDataMemory *)local_50,(UErrorCode *)dataMemory._48_8_);
      UVar1 = U_FAILURE(*(UErrorCode *)dataMemory._48_8_);
      if (UVar1 == '\0') {
        setCommonICUData((UDataMemory *)local_50,'\x01',(UErrorCode *)dataMemory._48_8_);
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_setCommonData(const void *data, UErrorCode *pErrorCode) {
    UDataMemory dataMemory;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    if(data==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    /* set the data pointer and test for validity */
    UDataMemory_init(&dataMemory);
    UDataMemory_setData(&dataMemory, data);
    udata_checkCommonData(&dataMemory, pErrorCode);
    if (U_FAILURE(*pErrorCode)) {return;}

    /* we have good data */
    /* Set it up as the ICU Common Data.  */
    setCommonICUData(&dataMemory, TRUE, pErrorCode);
}